

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O0

void __thiscall
mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::erase
          (gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_> *this,
          gc_heap_ptr_untracked<mjs::object,_false> *elem)

{
  gc_heap_ptr_untracked<mjs::object,_false> *pgVar1;
  bool bVar2;
  gc_heap_ptr_untracked<mjs::object,_false> *elem_local;
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_> *this_local;
  
  pgVar1 = begin(this);
  bVar2 = false;
  if (pgVar1 <= elem) {
    pgVar1 = end(this);
    bVar2 = elem < pgVar1;
  }
  if (!bVar2) {
    __assert_fail("elem >= begin() && elem < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                  ,0x3a,
                  "void mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object, false>>::erase(T *) [T = mjs::gc_heap_ptr_untracked<mjs::object, false>]"
                 );
  }
  pgVar1 = begin(this);
  erase(this,(uint32_t)((long)elem - (long)pgVar1 >> 2));
  return;
}

Assistant:

void erase(T* elem) {
        assert(elem >= begin() && elem < end());
        erase(static_cast<uint32_t>(elem - begin()));
    }